

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O3

void canvas_startmotion(_glist *x)

{
  t_editor *ptVar1;
  _instanceeditor *p_Var2;
  int iVar3;
  int iVar4;
  
  ptVar1 = x->gl_editor;
  if (ptVar1 != (t_editor *)0x0) {
    p_Var2 = (pd_maininstance.pd_gui)->i_editor;
    iVar3 = 0x28;
    iVar4 = 0x28;
    if (*(_glist **)(p_Var2 + 0x78) == x) {
      iVar4 = *(int *)(p_Var2 + 0x80);
      iVar3 = *(int *)(p_Var2 + 0x84);
      if (iVar3 == 0 && iVar4 == 0) {
        return;
      }
    }
    ptVar1->field_0x88 = (ptVar1->field_0x88 & 0xf8) + 1;
    ptVar1 = x->gl_editor;
    ptVar1->e_xwas = iVar4;
    ptVar1->e_ywas = iVar3;
  }
  return;
}

Assistant:

void canvas_startmotion(t_canvas *x)
{
    int xval, yval;
    if (!x->gl_editor) return;
    glist_getnextxy(x, &xval, &yval);
    if (xval == 0 && yval == 0) return;
    x->gl_editor->e_onmotion = MA_MOVE;
    x->gl_editor->e_xwas = xval;
    x->gl_editor->e_ywas = yval;
}